

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

int * __thiscall ConvexDecomposition::cbtHullTriangle::neib(cbtHullTriangle *this,int a,int b)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x943,"int &ConvexDecomposition::cbtHullTriangle::neib(int, int)");
    }
    iVar1 = (&(this->super_int3).x)[lVar2];
    uVar4 = (int)lVar2 + 1;
    if (lVar2 == 2) {
      uVar4 = 0;
    }
    if (((iVar1 == a) && ((&(this->super_int3).x)[uVar4] == b)) ||
       ((iVar1 == b && ((&(this->super_int3).x)[uVar4] == a)))) break;
    lVar2 = lVar2 + 1;
  }
  lVar3 = 2;
  if (lVar2 != 0) {
    lVar3 = lVar2 + -1;
  }
  return &(this->n).x + lVar3;
}

Assistant:

int &cbtHullTriangle::neib(int a,int b)
{
	static int er=-1;
	int i;
	for(i=0;i<3;i++) 
	{
		int i1=(i+1)%3;
		int i2=(i+2)%3;
		if((*this)[i]==a && (*this)[i1]==b) return n[i2];
		if((*this)[i]==b && (*this)[i1]==a) return n[i2];
	}
	assert(0);
	return er;
}